

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
fmt::v8::basic_format_specs<char>::basic_format_specs(basic_format_specs<char> *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0xffffffff;
  *(undefined1 *)(in_RDI + 2) = 0;
  *(ushort *)((long)in_RDI + 9) = *(ushort *)((long)in_RDI + 9) & 0xfff0;
  *(ushort *)((long)in_RDI + 9) = *(ushort *)((long)in_RDI + 9) & 0xff8f;
  *(ushort *)((long)in_RDI + 9) = *(ushort *)((long)in_RDI + 9) & 0xff7f;
  *(ushort *)((long)in_RDI + 9) = *(ushort *)((long)in_RDI + 9) & 0xfeff;
  detail::fill_t<char>::fill_t((fill_t<char> *)((long)in_RDI + 0xb));
  return;
}

Assistant:

constexpr basic_format_specs()
      : width(0),
        precision(-1),
        type(presentation_type::none),
        align(align::none),
        sign(sign::none),
        alt(false),
        localized(false) {}